

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundatanode_inmem.c
# Opt level: O3

SUNErrCode SUNDataNode_AddNamedChild_InMem(SUNDataNode self,char *name,SUNDataNode child_node)

{
  long *plVar1;
  SUNErrCode SVar2;
  int64_t iVar3;
  
  *(char **)((long)child_node->content + 0x18) = name;
  iVar3 = SUNHashMap_Insert(*(SUNHashMap *)((long)self->content + 0x20),name,child_node);
  SVar2 = -0x2706;
  if (iVar3 == 0) {
    *(SUNDataNode *)child_node->content = self;
    plVar1 = (long *)((long)self->content + 0x28);
    *plVar1 = *plVar1 + 1;
    SVar2 = 0;
  }
  return SVar2;
}

Assistant:

SUNErrCode SUNDataNode_AddNamedChild_InMem(SUNDataNode self, const char* name,
                                           SUNDataNode child_node)
{
  SUNFunctionBegin(self->sunctx);

  SUNAssert(BASE_MEMBER(self, dtype) == SUNDATANODE_OBJECT,
            SUN_ERR_ARG_WRONGTYPE);

  IMPL_MEMBER(child_node, name) = name;
  if (SUNHashMap_Insert(IMPL_MEMBER(self, named_children), name, child_node))
  {
    return SUN_ERR_OP_FAIL;
  }

  IMPL_MEMBER(child_node, parent) = self;
  IMPL_MEMBER(self, num_named_children)++;

  return SUN_SUCCESS;
}